

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void asm_make_ast(void *_line)

{
  byte bVar1;
  int iVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *local_28;
  
  for (; (bVar1 = *_line, bVar1 == 9 || (bVar1 == 0x20)); _line = (void *)((long)_line + 1)) {
  }
  pbVar6 = (byte *)_line;
  if (bVar1 != 0) {
    while ((((byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
           ((local_28 = pbVar6, bVar1 - 0x24 < 0x3c &&
            ((0x800000000000681U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) != 0))))) {
      bVar1 = pbVar6[1];
      pbVar6 = pbVar6 + 1;
    }
    while (bVar1 == 0x3a) {
      puVar3 = (undefined4 *)malloc(0x10);
      *puVar3 = 0;
      *pbVar6 = 0;
      ptr_ll_add(cur_ast.nodes,puVar3);
      _line = pbVar6 + 1;
      pbVar6 = (byte *)_line;
      while (((bVar1 = *pbVar6, (byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a))
             || ((bVar1 - 0x24 < 0x3c &&
                 ((0x800000000000681U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) != 0))))) {
        pbVar6 = pbVar6 + 1;
      }
    }
    local_28 = pbVar6;
    if (*_line == 0x2e) {
      pbVar5 = (byte *)((long)_line + 1);
      puVar3 = (undefined4 *)malloc(0x10);
      *puVar3 = 2;
      puVar4 = (undefined8 *)malloc(0x10);
      *(undefined8 **)(puVar3 + 2) = puVar4;
      *pbVar6 = 0;
      *puVar4 = pbVar5;
      for (; bVar1 = *pbVar5, bVar1 != 0; pbVar5 = pbVar5 + 1) {
        if ('`' < (char)bVar1) {
          *pbVar5 = bVar1 - 0x20;
        }
      }
      ptr_ll_add(cur_ast.nodes,puVar3);
      return;
    }
    *pbVar6 = 0;
    for (pbVar6 = (byte *)_line; bVar1 = *pbVar6, bVar1 != 0; pbVar6 = pbVar6 + 1) {
      if ('`' < (char)bVar1) {
        *pbVar6 = bVar1 - 0x20;
      }
    }
    iVar2 = strcmp("BRK",(char *)_line);
    if ((((iVar2 != 0) && (iVar2 = strcmp("ORA",(char *)_line), iVar2 != 0)) &&
        (iVar2 = strcmp("COP",(char *)_line), iVar2 != 0)) &&
       (((iVar2 = strcmp("TSB",(char *)_line), iVar2 != 0 &&
         (iVar2 = strcmp("ASL",(char *)_line), iVar2 != 0)) &&
        ((iVar2 = strcmp("PHP",(char *)_line), iVar2 != 0 &&
         (iVar2 = strcmp("PHD",(char *)_line), iVar2 != 0)))))) {
      iVar2 = strcmp("BPL",(char *)_line);
      if (iVar2 == 0) {
        asm_parse_rel((char **)&local_28);
      }
      else {
        iVar2 = strcmp("TRB",(char *)_line);
        if (((iVar2 != 0) && (iVar2 = strcmp("CLC",(char *)_line), iVar2 != 0)) &&
           ((iVar2 = strcmp("INC",(char *)_line), iVar2 != 0 &&
            (((iVar2 = strcmp("TCS",(char *)_line), iVar2 != 0 &&
              (iVar2 = strcmp("JSR",(char *)_line), iVar2 != 0)) &&
             (iVar2 = strcmp("AND",(char *)_line), iVar2 != 0)))))) {
          iVar2 = strcmp("JSL",(char *)_line);
          if (iVar2 == 0) {
            asm_parse_long((char **)&local_28);
          }
          else {
            iVar2 = strcmp("BIT",(char *)_line);
            if (iVar2 != 0) {
              fprintf(_stderr,"Error: unrecognized instruction \"%s\"!\n",_line);
              exit(1);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void asm_make_ast(void *_line) {
    char *line = (char*)_line;
    while(*line == ' ' || *line == '\t') line++;
    if(*line == 0) return;
    char *opStart = line;
    while(
        (*line >= 'A' && *line <= 'Z') ||
        (*line >= 'a' && *line <= 'z') ||
        (*line >= '0' && *line <= '9') ||
        *line == '$' ||
        *line == '_' ||
        *line == '.' ||
        *line == '+' ||
        *line == '-'
    ) line++;

    while(*line == ':') {
        // Label
        struct asm_ast_node_generic *node = malloc(sizeof(struct asm_ast_node_generic));
        node->type = 0;
        struct asm_ast_label *label = malloc(sizeof(struct asm_ast_label));
        *line = 0; // Nice null terminator ;)
        label->label = opStart;
        ptr_ll_add(cur_ast.nodes, node);

        // Right, now we need to reset in case there's a label or another instruction after this. Right.
        line++;
        opStart = line;
        while(
            (*line >= 'A' && *line <= 'Z') ||
            (*line >= 'a' && *line <= 'z') ||
            (*line >= '0' && *line <= '9') ||
            *line == '$' ||
            *line == '_' ||
            *line == '.' ||
            *line == '+' ||
            *line == '-'
        ) line++;
    }
    if(*opStart == '.') {
        opStart++; // Directive
        struct asm_ast_node_generic *node = malloc(sizeof(struct asm_ast_node_generic));
        node->type = 2;
        struct asm_ast_directive *directive = malloc(sizeof(struct asm_ast_directive));
        node->node = directive;
        *line = 0; // Null terminate, as always
        directive->directive = opStart;
        while(*opStart != 0) { // And now, to capitalize
            if(*opStart >= 'a') *opStart -= 'a' - 'A';
            opStart++;
        }
        // I know that plenty of directives have parameters.
        // I'm going to ignore that for now, because I don't know what they are.
        ptr_ll_add(cur_ast.nodes, node);
    } else { // Instruction
        *line = 0; // Null terminate. Of course.
        char *trueOpStart = opStart;
        while(*opStart != 0) { // And now, to capitalize. Early.
            if(*opStart >= 'a') *opStart -= 'a' - 'A';
            opStart++;
        }
        opStart = trueOpStart;
        struct asm_ast_node_generic *node = malloc(sizeof(struct asm_ast_node_generic));
        node->type = 1;
        struct asm_ast_instruction *instruction = malloc(sizeof(struct asm_ast_instruction));
        if(!strcmp("BRK", opStart)) { // Fun fact, !strcmp means they're equal.
            instruction->opcode = 0;
        } else if(!strcmp("ORA", opStart)) { // Opcodes $01, $03, $05, $07, $09, $0D, $0F, $11, $12, $13, $15, $17, $19, $1D, $1F
            
        } else if(!strcmp("COP", opStart)) {
            instruction->opcode = 2;
        } else if(!strcmp("TSB", opStart)) { // Opcodes $04, $0C
            
        } else if(!strcmp("ASL", opStart)) { // Opcodes $06, $0A, $0E, $16, $1E
            
        } else if(!strcmp("PHP", opStart)) {
            instruction->opcode = 8;
        } else if(!strcmp("PHD", opStart)) {
            instruction->opcode = 0xB;
        } else if(!strcmp("BPL", opStart)) {
            instruction->opcode = 0x10;
            struct asm_ast_param **params = malloc(1*sizeof(struct asm_ast_param)); // 1 operand
            params[0] = asm_parse_rel(&line);
            instruction->params = params;
        } else if(!strcmp("TRB", opStart)) { // Opcodes $14, $1C
            
        } else if(!strcmp("CLC", opStart)) {
            instruction->opcode = 0x18;
        } else if(!strcmp("INC", opStart)) { // Opcodes $1A, $E6, $EE, $F6, $FE
            
        } else if(!strcmp("TCS", opStart)) {
            instruction->opcode = 0x1B;
        } else if(!strcmp("JSR", opStart)) { // Opcodes $20, $FC
            
        } else if(!strcmp("AND", opStart)) { // Opcodes $21, $23, $25, $27, $29, $2D, $2F, $31, $32, $33, $35, $37, $39, $3D, $3F
            
        } else if(!strcmp("JSL", opStart)) {
            instruction->opcode = 0x22;
            struct asm_ast_param **params = malloc(1*sizeof(struct asm_ast_param)); // 1 operand
            params[0] = asm_parse_long(&line);
            instruction->params = params;
        } else if(!strcmp("BIT", opStart)) { // Opcodes $24, $2C, $34, $3C, $89
            
        } else {
            fprintf(stderr, "Error: unrecognized instruction \"%s\"!\n", opStart);
            exit(1);
        }
    }
}